

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_2,_2> __thiscall
tcu::operator-(tcu *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_2> *b)

{
  long lVar1;
  Matrix<float,_2,_2> *res;
  int row;
  tcu *ptVar2;
  int col;
  long lVar3;
  bool bVar4;
  Vector<float,_2> VVar5;
  Matrix<float,_2,_2> MVar6;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = 0;
  ptVar2 = this;
  do {
    lVar3 = 0;
    do {
      VVar5.m_data[0] = 1.0;
      VVar5.m_data[1] = 0.0;
      if (lVar1 != lVar3) {
        VVar5.m_data[0] = 0.0;
        VVar5.m_data[1] = 0.0;
      }
      *(float *)(ptVar2 + lVar3 * 8) = VVar5.m_data[0];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    ptVar2 = ptVar2 + 4;
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  lVar1 = 0;
  do {
    lVar3 = 0;
    do {
      MVar6.m_data.m_data[0].m_data[0] =
           ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)a)->m_data)->m_data[0].m_data
           [lVar3] - ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)b)->m_data)->m_data
                     [0].m_data[lVar3];
      *(float *)(this + lVar3 * 4) = MVar6.m_data.m_data[0].m_data[0];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    this = this + 8;
    b = (Matrix<float,_2,_2> *)((long)b + 8);
    a = (Matrix<float,_2,_2> *)((long)a + 8);
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  MVar6.m_data.m_data[0].m_data[1] = 0.0;
  MVar6.m_data.m_data[1].m_data[0] = VVar5.m_data[0];
  MVar6.m_data.m_data[1].m_data[1] = VVar5.m_data[1];
  return (Matrix<float,_2,_2>)MVar6.m_data.m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) - b(row, col);
	return res;
}